

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O1

void __thiscall
helics::apps::Source::Source(Source *this,string_view appName,CoreApp *core,FederateInfo *fedInfo)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  
  apps::App::App(&this->super_App,appName,core,fedInfo);
  (this->super_App)._vptr_App = (_func_int **)&PTR__Source_00559560;
  (this->sources).
  super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>._M_impl
  .super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->sources).
  super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>._M_impl
  .super__Deque_impl_data._M_map_size = 0;
  (this->sources).
  super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>._M_impl
  .super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->sources).
  super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>._M_impl
  .super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->sources).
  super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>._M_impl
  .super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->sources).
  super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>._M_impl
  .super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->sources).
  super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>._M_impl
  .super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->sources).
  super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>._M_impl
  .super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->sources).
  super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>._M_impl
  .super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->sources).
  super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>._M_impl
  .super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  CLI::std::_Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>::
  _M_initialize_map(&(this->sources).
                     super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
                    ,0);
  (this->generators).
  super__Vector_base<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->generators).
  super__Vector_base<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->generators).
  super__Vector_base<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->generatorLookup)._M_t._M_impl.super__Rb_tree_header;
  (this->generatorLookup)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->generatorLookup)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->generatorLookup)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->generatorLookup)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  p_Var1 = &(this->pubids)._M_t._M_impl.super__Rb_tree_header;
  (this->pubids)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->pubids)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->generatorLookup)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->endpoints).super__Vector_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->endpoints).super__Vector_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->endpoints).super__Vector_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pubids)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->pubids)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->pubids)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->defaultPeriod).internalTimeCode = 1000000000;
  if ((this->super_App).deactivated == false) {
    peVar2 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*(peVar2->super_ValueFederate)._vptr_ValueFederate[2])(peVar2,4,1);
    apps::App::loadInputFiles(&this->super_App);
  }
  return;
}

Assistant:

Source::Source(std::string_view appName, CoreApp& core, const FederateInfo& fedInfo):
        App(appName, core, fedInfo)
    {
        initialSetup();
    }